

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * vkt::shaderexecutor::
       ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doRound
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,Matrix<float,_2,_3> *value)

{
  Matrix<float,_2,_3> *this;
  FloatFormat *fmt_00;
  Vector<tcu::Interval,_2> *__dest;
  Vector<float,_2> *in_RCX;
  IVal local_58;
  int local_28;
  undefined1 local_21;
  int ndx;
  Matrix<float,_2,_3> *value_local;
  FloatFormat *fmt_local;
  IVal *ret;
  
  local_21 = 0;
  _ndx = value;
  value_local = (Matrix<float,_2,_3> *)fmt;
  fmt_local = (FloatFormat *)__return_storage_ptr__;
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix(__return_storage_ptr__);
  for (local_28 = 0; this = value_local, local_28 < 3; local_28 = local_28 + 1) {
    fmt_00 = (FloatFormat *)tcu::Matrix<float,_2,_3>::operator[](value,local_28);
    round<tcu::Vector<float,2>>(&local_58,(shaderexecutor *)this,fmt_00,in_RCX);
    __dest = tcu::Matrix<tcu::Interval,_2,_3>::operator[](__return_storage_ptr__,local_28);
    memcpy(__dest,&local_58,0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}